

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O0

void __thiscall
trimesh::dataset_t::
get_mfold<(trimesh::eGDIR)0,boost::range_detail::transformed_range<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::vector<int,std::allocator<int>>>>
          (dataset_t *this,mfold_t *mfold,
          transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
          *rng)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  type_conflict1 tVar1;
  bool bVar2;
  reference c_00;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  ostream *poVar6;
  runtime_error *this_01;
  cellid_t *pcVar7;
  transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  *r;
  transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  *r_00;
  int local_330;
  undefined1 local_329;
  cellid_t p;
  stringstream local_308 [8];
  stringstream ss;
  ostream local_2f8 [380];
  cellid_t local_17c;
  cellid_t **ppcStack_178;
  cellid_t c;
  cellid_t *fb;
  cellid_t *fe;
  cellid_t f [20];
  reference local_e8;
  int local_e4;
  undefined1 local_e0 [4];
  int dim;
  remove_cv_ref_t<decltype(boost::end(rng))> e;
  undefined1 local_a0 [8];
  remove_cv_ref_t<decltype(boost::begin(rng))> b;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  *rng_local;
  mfold_t *mfold_local;
  dataset_t *this_local;
  
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)
             (b.m_f.m_impl.super_type.m_storage.dummy_.data + 0x18));
  boost::range_adl_barrier::
  begin<boost::range_detail::transformed_range<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::vector<int,std::allocator<int>>>>
            ((type *)local_a0,(range_adl_barrier *)rng,r);
  boost::range_adl_barrier::
  end<boost::range_detail::transformed_range<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::vector<int,std::allocator<int>>>>
            ((type *)local_e0,(range_adl_barrier *)rng,r_00);
  c_00 = boost::iterators::detail::
         iterator_facade_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
         ::operator*((iterator_facade_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
                      *)local_a0);
  local_e4 = cell_dim(this,c_00);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                             *)local_a0,
                            (iterator_facade<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                             *)local_e0), tVar1) {
    boost::iterators::operator++
              ((type *)(f + 0x12),
               (iterator_facade<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                *)local_a0,0);
    local_e8 = boost::iterators::detail::
               iterator_facade_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long,_false,_false>
                            *)(f + 0x12));
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
               ((long)&b.m_f.m_impl.super_type.m_storage.dummy_ + 0x18),&local_e8);
    boost::iterators::
    transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
    ::~transform_iterator
              ((transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
                *)(f + 0x12));
  }
  while( true ) {
    bVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                       ((long)&b.m_f.m_impl.super_type.m_storage.dummy_ + 0x18));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      boost::iterators::
      transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
      ::~transform_iterator
                ((transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
                  *)local_e0);
      boost::iterators::
      transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
      ::~transform_iterator
                ((transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
                  *)local_a0);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                 ((long)&b.m_f.m_impl.super_type.m_storage.dummy_ + 0x18));
      return;
    }
    this_00 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)
              ((long)&b.m_f.m_impl.super_type.m_storage.dummy_ + 0x18);
    pvVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(this_00);
    local_17c = *pvVar5;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(this_00);
    iVar3 = cell_dim(this,local_17c);
    if (iVar3 != local_e4) break;
    std::vector<int,_std::allocator<int>_>::push_back(mfold,&local_17c);
    ppcStack_178 = &fe;
    uVar4 = get_cets<(trimesh::eGDIR)0>(this,local_17c,(cellid_t *)&fe);
    fb = (cellid_t *)((long)&fe + (ulong)uVar4 * 4);
    for (; ppcStack_178 != (cellid_t **)fb; ppcStack_178 = (cellid_t **)((long)ppcStack_178 + 4)) {
      bVar2 = is_paired(this,*(cellid_t *)ppcStack_178);
      if (bVar2) {
        pcVar7 = pair(this,*(cellid_t *)ppcStack_178);
        local_330 = *pcVar7;
        if ((local_330 != local_17c) && (iVar3 = cell_dim(this,local_330), iVar3 == local_e4)) {
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                     ((long)&b.m_f.m_impl.super_type.m_storage.dummy_ + 0x18),&local_330);
        }
      }
    }
  }
  std::__cxx11::stringstream::stringstream(local_308);
  poVar6 = std::operator<<(local_2f8,"Failed to assert condition ");
  poVar6 = std::operator<<(poVar6,"cell_dim(c) == dim");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"at (");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                          );
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = std::operator<<(poVar6,"get_mfold");
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xca);
  std::operator<<(poVar6,") \n ");
  local_329 = 1;
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_01,(string *)&p);
  local_329 = 0;
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void dataset_t::get_mfold(mfold_t &mfold,rng_t rng)
  {
    std::stack<cellid_t> stk;

    BOOST_AUTO(b,boost::begin(rng));
    BOOST_AUTO(e,boost::end(rng));

    int dim = cell_dim(*b);

    while ( b!= e) stk.push(*b++);

    cellid_t f[20],*fe,*fb;

    while(!stk.empty())
    {
      cellid_t c = stk.top(); stk.pop();

      ASSERT(cell_dim(c) == dim);

      mfold.push_back(c);

      fb = f; fe = f + get_cets<dir>(c,f);

      for (; fb != fe; ++fb )
        if( is_paired(*fb))
        {
          cellid_t p = pair(*fb);
          if(p != c && cell_dim(p) == dim)
            stk.push(p);
        }
    }
  }